

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * __thiscall Instrument::get_name_abi_cxx11_(string *__return_storage_ptr__,Instrument *this)

{
  int iVar1;
  undefined8 in_RAX;
  char *__args_1;
  size_t sVar2;
  int local_34 [2];
  int length;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            (&this->ismsnoop_->get_name,this->instrument_,(char *)0x0,local_34);
  iVar1 = -1;
  if (-2 < local_34[0]) {
    iVar1 = local_34[0] + 1;
  }
  __args_1 = (char *)operator_new__((long)iVar1);
  std::function<void_(ISMSnoopInstrument_*,_char_*,_int_*)>::operator()
            (&this->ismsnoop_->get_name,this->instrument_,__args_1,local_34);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__args_1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__args_1,__args_1 + sVar2);
  operator_delete__(__args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string Instrument::get_name() const
{
	int length;

	ismsnoop_->get_name(instrument_, nullptr, &length);

	const auto c_name = new char[length + 1];
	
	ismsnoop_->get_name(instrument_, c_name, &length);

	std::string result(c_name);

	delete[] c_name;

	return result;
}